

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O0

Bdd __thiscall
sylvan::Bdd::VariablesCube(Bdd *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *variables)

{
  size_type sVar1;
  reference pvVar2;
  undefined4 local_24;
  MTBDD MStack_20;
  int i;
  BDD result;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *variables_local;
  
  MStack_20 = 0x8000000000000000;
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(variables);
  local_24 = (int)sVar1;
  while (local_24 = local_24 + -1, -1 < local_24) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (variables,(long)local_24);
    MStack_20 = mtbdd_makenode(*pvVar2,0,MStack_20);
  }
  Bdd(this,MStack_20);
  return (Bdd)(BDD)this;
}

Assistant:

Bdd
Bdd::VariablesCube(std::vector<uint32_t> variables)
{
    BDD result = sylvan_true;
    for (int i=variables.size()-1; i>=0; i--) {
        result = sylvan_makenode(variables[i], sylvan_false, result);
    }
    return result;
}